

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void av1_rd_use_partition
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,MB_MODE_INFO **mib,
               TokenExtra **tp,int mi_row,int mi_col,BLOCK_SIZE bsize,int *rate,int64_t *dist,
               int do_recon,PC_TREE *pc_tree)

{
  int (*paiVar1) [10];
  uint8_t uVar2;
  byte bVar3;
  BLOCK_SIZE BVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  MB_MODE_INFO **ppMVar8;
  byte bVar9;
  RD_STATS best_rd;
  RD_STATS best_rd_00;
  RD_STATS best_rd_01;
  RD_STATS best_rd_02;
  RD_STATS best_rd_03;
  RD_STATS best_rd_04;
  BLOCK_SIZE BVar10;
  int iVar11;
  ulong uVar12;
  PICK_MODE_CONTEXT *pPVar13;
  PC_TREE *pPVar14;
  uint uVar15;
  int iVar16;
  byte bVar17;
  int iVar18;
  int i;
  long lVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  RD_STATS invalid_rdc;
  RD_STATS tmp_rdc;
  RD_STATS none_rdc;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  PARTITION_TYPE partition;
  undefined4 uVar26;
  int *piVar25;
  int64_t *in_stack_fffffffffffffd10;
  undefined4 uVar27;
  undefined8 uVar28;
  int local_2a0;
  RD_STATS local_270;
  long local_248;
  PC_TREE_SHARED_BUFFERS *local_240;
  TokenExtra **local_238;
  int64_t *local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_210;
  undefined7 uStack_20f;
  PICK_MODE_CONTEXT *local_208;
  ModeCosts *local_200;
  MB_MODE_INFO **local_1f8;
  ulong local_1f0;
  int local_1e4;
  RD_STATS local_1e0;
  RD_STATS local_1b8;
  long local_190;
  long local_188;
  RD_SEARCH_MACROBLOCK_CONTEXT local_180;
  
  uVar12 = (ulong)bsize;
  uVar2 = ((cpi->common).seq_params)->monochrome;
  bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar12];
  local_1f0 = (ulong)bVar3;
  if (uVar12 < 3) {
    local_248 = 0;
  }
  else {
    lVar19 = (ulong)""[uVar12] - 1;
    local_248 = (ulong)((uint)(((uint)(int)(td->mb).e_mbd.above_partition_context[mi_col] >>
                                ((uint)lVar19 & 0x1f) & 1) != 0) +
                       ((uint)(int)(td->mb).e_mbd.left_partition_context[mi_row & 0x1f] >>
                        ((byte)lVar19 & 0x1f) & 1) * 2) + (ulong)""[uVar12] * 4 + -4;
  }
  bVar9 = bVar3 >> 1;
  if (bsize < BLOCK_8X8) {
    bVar17 = 0;
  }
  else {
    iVar18 = (cpi->common).mi_params.mi_rows;
    bVar17 = 0xff;
    if ((mi_row < iVar18) && (iVar11 = (cpi->common).mi_params.mi_cols, mi_col < iVar11)) {
      iVar21 = (cpi->common).mi_params.mi_stride;
      ppMVar8 = (cpi->common).mi_params.mi_grid_base;
      lVar19 = (long)(iVar21 * mi_row + mi_col);
      BVar10 = ppMVar8[lVar19]->bsize;
      if (BVar10 == bsize) {
        bVar17 = 0;
      }
      else {
        bVar5 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar12]
        ;
        bVar6 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar10]
        ;
        bVar7 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar10]
        ;
        if (((bsize == BLOCK_8X8) || (iVar18 <= (int)((uint)bVar9 + mi_row))) ||
           (iVar11 <= (int)(mi_col + (uint)(bVar5 >> 1)))) {
          bVar17 = *(byte *)((long)&get_partition_base_partitions +
                            (ulong)(bVar6 < bVar5) + (ulong)(bVar7 < bVar3) * 2);
        }
        else if (bVar7 == bVar3) {
          bVar17 = 8;
          if ((uint)bVar6 << 2 != (uint)bVar5) {
            bVar17 = (ppMVar8[lVar19 + (int)((uint)(bVar5 >> 1) * iVar21)]->bsize != BVar10) *
                     '\x04' + 1;
          }
        }
        else if (bVar6 == bVar5) {
          bVar17 = 9;
          if ((uint)bVar7 << 2 != (uint)bVar3) {
            bVar17 = (ppMVar8[lVar19 + (ulong)bVar9]->bsize != BVar10) * '\x05' + 2;
          }
        }
        else {
          bVar17 = 3;
          if (((uint)bVar6 * 2 == (uint)bVar5 && (uint)bVar7 * 2 == (uint)bVar3) &&
             (bVar17 = 4,
             "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [ppMVar8[lVar19 + (int)((uint)(bVar5 >> 1) * iVar21)]->bsize] != bVar3)) {
            bVar17 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [ppMVar8[lVar19 + (ulong)bVar9]->bsize] == bVar5) * '\x03' + 3;
          }
        }
      }
    }
  }
  BVar10 = BLOCK_INVALID;
  if (bVar17 == 0xff) goto LAB_001e5135;
  switch(uVar12) {
  case 0:
    bVar24 = false;
    goto LAB_001e511c;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_001e50c1_caseD_1:
    uVar12 = 6;
    bVar24 = true;
    goto LAB_001e511c;
  case 3:
    uVar12 = 1;
    break;
  case 6:
    uVar12 = 2;
    break;
  case 9:
    uVar12 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar12 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001e50c1_caseD_1;
      uVar12 = 5;
    }
  }
  bVar24 = false;
LAB_001e511c:
  if (!bVar24) {
    BVar10 = subsize_lookup[bVar17][uVar12];
  }
LAB_001e5135:
  BVar4 = (*mib)->bsize;
  (td->mb).try_merge_partition = 0;
  local_238 = tp;
  if (pc_tree->none == (PICK_MODE_CONTEXT *)0x0) {
    pPVar13 = av1_alloc_pmc(cpi,bsize,&td->shared_coeff_buf);
    pc_tree->none = pPVar13;
    if (pPVar13 == (PICK_MODE_CONTEXT *)0x0) {
      aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
    }
  }
  if ((cpi->common).mi_params.mi_rows <= mi_row) {
    return;
  }
  if ((cpi->common).mi_params.mi_cols <= mi_col) {
    return;
  }
  iVar18 = (uint)(uVar2 == '\0') * 2 + 1;
  local_208 = pc_tree->none;
  local_270.rate = 0x7fffffff;
  local_270.zero_rate = 0;
  local_270.dist = 0x7fffffffffffffff;
  local_270.rdcost = 0x7fffffffffffffff;
  local_270.sse = 0x7fffffffffffffff;
  local_270.skip_txfm = '\0';
  local_1b8.rate = 0x7fffffff;
  local_1b8.dist = 0x7fffffffffffffff;
  local_1b8.rdcost = 0x7fffffffffffffff;
  local_1b8.sse = 0x7fffffffffffffff;
  local_1b8.skip_txfm = '\0';
  local_1b8.zero_rate = 0;
  local_230 = (int64_t *)0x7fffffff;
  uStack_228 = 0x7fffffffffffffff;
  local_220 = 0x7fffffffffffffff;
  uStack_218 = 0x7fffffffffffffff;
  local_210 = 0;
  pc_tree->partitioning = bVar17;
  (td->mb).e_mbd.above_txfm_context =
       (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] + mi_col;
  (td->mb).e_mbd.left_txfm_context = (td->mb).e_mbd.left_txfm_context_buffer + (mi_row & 0x1f);
  local_1f8 = mib;
  av1_save_context(&td->mb,&local_180,mi_row,mi_col,bsize,iVar18);
  if ((bsize == BLOCK_16X16) && (cpi->vaq_refresh != 0)) {
    av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,BLOCK_16X16);
    iVar11 = av1_log_block_var(cpi,&td->mb,BLOCK_16X16);
    (td->mb).mb_energy = iVar11;
  }
  local_200 = &(td->mb).mode_costs;
  local_1e4 = (td->mb).rdmult;
  uVar12 = 0;
  setup_block_rdmult(cpi,&td->mb,mi_row,mi_col,bsize,'\0',(MB_MODE_INFO *)0x0);
  ppMVar8 = local_1f8;
  local_240 = (PC_TREE_SHARED_BUFFERS *)CONCAT71(local_240._1_7_,1);
  if (((bVar17 != 0) && ((cpi->sf).part_sf.partition_search_type == '\x02')) &&
     (iVar11 = (cpi->sf).part_sf.adjust_var_based_rd_partitioning, iVar11 < 3 && iVar11 != 0)) {
    if (bsize < BLOCK_32X64) {
LAB_001e53f6:
      if (((int)((uint)bVar9 + mi_row) < (cpi->common).mi_params.mi_rows) &&
         ((int)(mi_col + (uint)bVar9) < (cpi->common).mi_params.mi_cols)) {
        (*local_1f8)->bsize = bsize;
        pc_tree->partitioning = '\0';
        (td->mb).try_merge_partition = 1;
        best_rd._33_7_ = uStack_20f;
        best_rd.skip_txfm = local_210;
        uVar12 = uVar12 & 0xffffffff00000000;
        best_rd.dist._0_4_ = (int)uStack_228;
        best_rd._0_8_ = local_230;
        best_rd.dist._4_4_ = (int)((ulong)uStack_228 >> 0x20);
        best_rd.rdcost = local_220;
        best_rd.sse = uStack_218;
        in_stack_fffffffffffffd10 = local_230;
        pick_sb_modes(cpi,tile_data,&td->mb,mi_row,mi_col,&local_1b8,'\0',bsize,local_208,best_rd);
        if ((long)local_1b8.rate != 0x7fffffff) {
          lVar19 = (long)local_200->partition_cost[local_248][0] + (long)local_1b8.rate;
          local_1b8.rate = (int)lVar19;
          local_1b8.rdcost = local_1b8.dist * 0x80 + ((td->mb).rdmult * lVar19 + 0x100 >> 9);
        }
        local_240 = (PC_TREE_SHARED_BUFFERS *)
                    CONCAT71(local_240._1_7_,
                             local_1b8.skip_txfm != '\x01' || local_1b8.rate == 0x7fffffff);
        av1_restore_context(&td->mb,&local_180,mi_row,mi_col,bsize,iVar18);
        (*ppMVar8)->bsize = BVar4;
        pc_tree->partitioning = bVar17;
      }
    }
    else if (iVar11 == 2) {
      iVar11 = (cpi->common).width;
      iVar21 = (cpi->common).height;
      if (iVar11 < iVar21) {
        iVar21 = iVar11;
      }
      if (((bsize == BLOCK_64X64) && (0x167 < iVar21)) &&
         (0xbe < (cpi->common).quant_params.base_qindex)) goto LAB_001e53f6;
    }
  }
  lVar19 = 0;
  do {
    pPVar14 = av1_alloc_pc_tree_node(BVar10);
    pc_tree->split[lVar19] = pPVar14;
    if (pPVar14 == (PC_TREE *)0x0) {
      aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,"Failed to allocate PC_TREE")
      ;
    }
    pc_tree->split[lVar19]->index = (int)lVar19;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  if (3 < bVar17) goto LAB_001e5ccc;
  switch((ulong)bVar17) {
  case 0:
    best_rd_00._33_7_ = uStack_20f;
    best_rd_00.skip_txfm = local_210;
    best_rd_00.dist._0_4_ = (int)uStack_228;
    best_rd_00._0_8_ = local_230;
    best_rd_00.dist._4_4_ = (int)((ulong)uStack_228 >> 0x20);
    best_rd_00.rdcost = local_220;
    best_rd_00.sse = uStack_218;
    in_stack_fffffffffffffd10 = local_230;
    pick_sb_modes(cpi,tile_data,&td->mb,mi_row,mi_col,&local_270,'\0',bsize,local_208,best_rd_00);
    goto LAB_001e5ccc;
  case 1:
    if ((char)local_240 != '\0') {
      lVar19 = 0;
      do {
        pPVar13 = av1_alloc_pmc(cpi,BVar10,&td->shared_coeff_buf);
        pc_tree->horizontal[lVar19] = pPVar13;
        if (pPVar13 == (PICK_MODE_CONTEXT *)0x0) {
          aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 == 1);
      best_rd_02._33_7_ = uStack_20f;
      best_rd_02.skip_txfm = local_210;
      uVar26 = (undefined4)(uVar12 >> 0x20);
      best_rd_02.dist._0_4_ = (int)uStack_228;
      best_rd_02._0_8_ = local_230;
      best_rd_02.dist._4_4_ = (int)((ulong)uStack_228 >> 0x20);
      best_rd_02.rdcost = local_220;
      best_rd_02.sse = uStack_218;
      in_stack_fffffffffffffd10 = local_230;
      pick_sb_modes(cpi,tile_data,&td->mb,mi_row,mi_col,&local_270,'\x01',BVar10,
                    pc_tree->horizontal[0],best_rd_02);
      if (((bsize < BLOCK_8X8) || (local_270.rate == 0x7fffffff)) ||
         (iVar21 = (uint)bVar9 + mi_row, (cpi->common).mi_params.mi_rows <= iVar21))
      goto LAB_001e5ccc;
      local_1e0.rate = 0;
      local_1e0.zero_rate = 0;
      local_1e0.dist = 0;
      local_1e0.rdcost = 0;
      local_1e0.sse = 0;
      local_1e0.skip_txfm = '\x01';
      piVar25 = (int *)CONCAT44(uVar26,1);
      av1_update_state(cpi,td,pc_tree->horizontal[0],mi_row,mi_col,BVar10,'\x01');
      encode_superblock(cpi,tile_data,td,local_238,'\x01',BVar10,piVar25);
      pPVar13 = pc_tree->horizontal[1];
      uVar28 = CONCAT71(uStack_20f,local_210);
      uVar26 = (undefined4)uStack_228;
      uVar27 = (undefined4)((ulong)uStack_228 >> 0x20);
      partition = '\x01';
      iVar11 = mi_col;
LAB_001e5c28:
      best_rd_03.dist._0_4_ = uVar26;
      best_rd_03._0_8_ = local_230;
      best_rd_03.dist._4_4_ = uVar27;
      best_rd_03.rdcost = local_220;
      best_rd_03.sse = uStack_218;
      best_rd_03._32_8_ = uVar28;
      in_stack_fffffffffffffd10 = local_230;
      pick_sb_modes(cpi,tile_data,&td->mb,iVar21,iVar11,&local_1e0,partition,BVar10,pPVar13,
                    best_rd_03);
      if (local_1e0.dist == 0x7fffffffffffffff || local_1e0.rate == 0x7fffffff) {
        local_270.rate = 0x7fffffff;
        local_270.zero_rate = 0;
        local_270.dist = 0x7fffffffffffffff;
        local_270.rdcost = 0x7fffffffffffffff;
        local_270.sse = 0x7fffffffffffffff;
        local_270.skip_txfm = '\0';
      }
      else {
        local_270.rate = local_270.rate + local_1e0.rate;
        local_270.dist = local_270.dist + local_1e0.dist;
        local_270.rdcost = local_270.rdcost + local_1e0.rdcost;
      }
      goto LAB_001e5ccc;
    }
    break;
  case 2:
    if ((char)local_240 != '\0') {
      lVar19 = 0;
      do {
        pPVar13 = av1_alloc_pmc(cpi,BVar10,&td->shared_coeff_buf);
        pc_tree->vertical[lVar19] = pPVar13;
        if (pPVar13 == (PICK_MODE_CONTEXT *)0x0) {
          aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 == 1);
      best_rd_01._33_7_ = uStack_20f;
      best_rd_01.skip_txfm = local_210;
      uVar26 = (undefined4)(uVar12 >> 0x20);
      best_rd_01.dist._0_4_ = (int)uStack_228;
      best_rd_01._0_8_ = local_230;
      best_rd_01.dist._4_4_ = (int)((ulong)uStack_228 >> 0x20);
      best_rd_01.rdcost = local_220;
      best_rd_01.sse = uStack_218;
      in_stack_fffffffffffffd10 = local_230;
      pick_sb_modes(cpi,tile_data,&td->mb,mi_row,mi_col,&local_270,'\x02',BVar10,
                    pc_tree->vertical[0],best_rd_01);
      if (((bsize < BLOCK_8X8) || (local_270.rate == 0x7fffffff)) ||
         (iVar11 = (uint)bVar9 + mi_col, (cpi->common).mi_params.mi_cols <= iVar11))
      goto LAB_001e5ccc;
      local_1e0.rate = 0;
      local_1e0.zero_rate = 0;
      local_1e0.dist = 0;
      local_1e0.rdcost = 0;
      local_1e0.sse = 0;
      local_1e0.skip_txfm = '\x01';
      piVar25 = (int *)CONCAT44(uVar26,1);
      av1_update_state(cpi,td,pc_tree->vertical[0],mi_row,mi_col,BVar10,'\x01');
      encode_superblock(cpi,tile_data,td,local_238,'\x01',BVar10,piVar25);
      pPVar13 = pc_tree->vertical[BLOCK_8X8 < bsize];
      uVar28 = CONCAT71(uStack_20f,local_210);
      uVar26 = (undefined4)uStack_228;
      uVar27 = (undefined4)((ulong)uStack_228 >> 0x20);
      partition = '\x02';
      iVar21 = mi_row;
      goto LAB_001e5c28;
    }
    break;
  case 3:
    if ((char)local_240 != '\0') {
      local_270.rate = 0;
      local_270.dist = 0;
      local_270.rdcost = 0;
      uVar12 = 0;
      do {
        uVar15 = 0;
        if ((uVar12 & 1) != 0) {
          uVar15 = (uint)bVar9;
        }
        iVar11 = ((uint)(uVar12 >> 1) & 0x7fffffff) * (uint)bVar9;
        iVar22 = iVar11 + mi_row;
        iVar21 = 0xe;
        if ((iVar22 < (cpi->common).mi_params.mi_rows) &&
           ((int)(mi_col + uVar15) < (cpi->common).mi_params.mi_cols)) {
          in_stack_fffffffffffffd10 = &local_1e0.dist;
          local_1e0.dist = 0;
          local_1e0.rdcost = 0;
          local_1e0.sse = 0;
          local_1e0.skip_txfm = '\x01';
          local_1e0.rate = 0;
          local_1e0.zero_rate = 0;
          av1_rd_use_partition
                    (cpi,td,tile_data,
                     local_1f8 +
                     (long)iVar11 * (long)(cpi->common).mi_params.mi_stride + (ulong)uVar15,
                     local_238,iVar22,mi_col + uVar15,BVar10,&local_1e0.rate,
                     in_stack_fffffffffffffd10,(uint)(uVar12 != 3),pc_tree->split[uVar12]);
          if (local_1e0.dist == 0x7fffffffffffffff || local_1e0.rate == 0x7fffffff) {
            local_270.rate = 0x7fffffff;
            local_270.zero_rate = 0;
            local_270.dist = 0x7fffffffffffffff;
            local_270.rdcost = 0x7fffffffffffffff;
            local_270.sse = 0x7fffffffffffffff;
            local_270.skip_txfm = '\0';
            iVar21 = 0xc;
          }
          else {
            local_270.rate = local_270.rate + local_1e0.rate;
            local_270.dist = local_270.dist + local_1e0.dist;
            iVar21 = 0;
          }
        }
      } while (((iVar21 == 0xe) || (iVar21 == 0)) && (uVar12 = uVar12 + 1, uVar12 != 4));
      goto LAB_001e5ccc;
    }
  }
  local_270.rate = 0x7fffffff;
  local_270.zero_rate = 0;
  local_270.dist = 0x7fffffffffffffff;
  local_270.rdcost = 0x7fffffffffffffff;
  local_270.sse = 0x7fffffffffffffff;
  local_270.skip_txfm = '\0';
LAB_001e5ccc:
  if ((long)local_270.rate != 0x7fffffff) {
    lVar19 = (long)local_200->partition_cost[local_248][bVar17] + (long)local_270.rate;
    local_270.rate = (int)lVar19;
    local_270.rdcost = local_270.dist * 0x80 + ((td->mb).rdmult * lVar19 + 0x100 >> 9);
  }
  iVar11 = 0x7fffffff;
  if (((((cpi->sf).part_sf.partition_search_type == '\x02') && (BLOCK_8X8 < bsize)) && (bVar17 != 3)
      ) && ((2 < (cpi->sf).part_sf.adjust_var_based_rd_partitioning &&
            (iVar21 = (cpi->common).mi_params.mi_rows,
            (uint)bVar9 + mi_row == iVar21 || (int)local_1f0 + mi_row < iVar21)))) {
    iVar21 = (cpi->common).mi_params.mi_cols;
    lVar19 = 0x7fffffffffffffff;
    uVar12 = 0x7fffffffffffffff;
    if ((uint)bVar9 + mi_col == iVar21 || (int)local_1f0 + mi_col < iVar21) {
      BVar10 = get_partition_subsize(bsize,'\x03');
      av1_restore_context(&td->mb,&local_180,mi_row,mi_col,bsize,iVar18);
      pc_tree->partitioning = '\x03';
      local_240 = &td->shared_coeff_buf;
      local_190 = local_248 * 5;
      paiVar1 = local_200->partition_cost + local_248;
      local_248 = CONCAT44(local_248._4_4_,(uint)BVar10);
      uVar20 = 0;
      uVar23 = 0;
      uVar12 = 0;
      do {
        iVar21 = ((uint)(uVar20 >> 1) & 0x7fffffff) * (uint)bVar9 + mi_row;
        iVar11 = 0x11;
        if (iVar21 < (cpi->common).mi_params.mi_rows) {
          uVar15 = 0;
          if ((uVar20 & 1) != 0) {
            uVar15 = (uint)bVar9;
          }
          iVar22 = uVar15 + mi_col;
          if (iVar22 < (cpi->common).mi_params.mi_cols) {
            local_1f0 = uVar12;
            av1_save_context(&td->mb,&local_180,mi_row,mi_col,bsize,iVar18);
            pPVar14 = pc_tree->split[uVar20];
            pPVar14->partitioning = '\0';
            if (pPVar14->none == (PICK_MODE_CONTEXT *)0x0) {
              pPVar13 = av1_alloc_pmc(cpi,(BLOCK_SIZE)local_248,local_240);
              pc_tree->split[uVar20]->none = pPVar13;
            }
            if (pc_tree->split[uVar20]->none == (PICK_MODE_CONTEXT *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PICK_MODE_CONTEXT");
            }
            best_rd_04._33_7_ = uStack_20f;
            best_rd_04.skip_txfm = local_210;
            best_rd_04.dist._0_4_ = (int)uStack_228;
            best_rd_04._0_8_ = local_230;
            best_rd_04.dist._4_4_ = (int)((ulong)uStack_228 >> 0x20);
            best_rd_04.rdcost = local_220;
            best_rd_04.sse = uStack_218;
            in_stack_fffffffffffffd10 = local_230;
            pick_sb_modes(cpi,tile_data,&td->mb,iVar21,iVar22,&local_1e0,'\x03',
                          (BLOCK_SIZE)local_248,pc_tree->split[uVar20]->none,best_rd_04);
            av1_restore_context(&td->mb,&local_180,mi_row,mi_col,bsize,iVar18);
            if (local_1e0.dist == 0x7fffffffffffffff || local_1e0.rate == 0x7fffffff) {
              iVar11 = 0xf;
              uVar23 = 0x7fffffff;
              uVar12 = 0x7fffffffffffffff;
            }
            else {
              lVar19 = local_1e0.dist;
              iVar16 = local_1e0.rate;
              if (uVar20 != 3) {
                local_208 = (PICK_MODE_CONTEXT *)CONCAT44(local_208._4_4_,local_1e0.rate);
                local_188 = local_1e0.dist;
                encode_sb(cpi,td,tile_data,local_238,iVar21,iVar22,'\0',(BLOCK_SIZE)local_248,
                          pc_tree->split[uVar20],(int *)in_stack_fffffffffffffd10);
                lVar19 = local_188;
                iVar16 = (int)local_208;
              }
              local_2a0 = (int)uVar23;
              uVar12 = local_1f0 + lVar19;
              iVar11 = 0;
              uVar23 = (ulong)(uint)(iVar16 + local_2a0 + (*paiVar1)[0]);
            }
          }
        }
      } while (((iVar11 == 0x11) || (iVar11 == 0)) && (uVar20 = uVar20 + 1, uVar20 != 4));
      if ((int)uVar23 == 0x7fffffff) {
        lVar19 = 0x7fffffffffffffff;
      }
      else {
        uVar23 = (long)(int)uVar23 + (long)local_200->partition_cost[0][local_190 * 2 + 3];
        lVar19 = uVar12 * 0x80 + ((long)((long)(td->mb).rdmult * uVar23 + 0x100) >> 9);
      }
      iVar11 = (int)uVar23;
    }
  }
  else {
    lVar19 = 0x7fffffffffffffff;
    uVar12 = 0x7fffffffffffffff;
  }
  if ((local_270.rdcost < lVar19) &&
     ((*local_1f8)->bsize = BVar4, lVar19 = local_270.rdcost, uVar12 = local_270.dist,
     iVar11 = local_270.rate, BLOCK_8X4 < bsize)) {
    pc_tree->partitioning = bVar17;
  }
  if (((local_1b8.rdcost != 0x7fffffffffffffff) &&
      (local_1b8.rdcost - (local_1b8.rdcost >> 9) < lVar19)) &&
     ((*local_1f8)->bsize = bsize, uVar12 = local_1b8.dist, iVar11 = local_1b8.rate,
     BLOCK_8X4 < bsize)) {
    pc_tree->partitioning = '\0';
  }
  av1_restore_context(&td->mb,&local_180,mi_row,mi_col,bsize,iVar18);
  if (do_recon != 0) {
    bVar24 = ((cpi->common).seq_params)->sb_size != bsize;
    if (!bVar24) {
      (td->mb).cb_offset[0] = 0;
      (td->mb).cb_offset[1] = 0;
    }
    encode_sb(cpi,td,tile_data,local_238,mi_row,mi_col,bVar24,bsize,pc_tree,
              (int *)in_stack_fffffffffffffd10);
  }
  *rate = iVar11;
  *dist = uVar12;
  (td->mb).rdmult = local_1e4;
  return;
}

Assistant:

void av1_rd_use_partition(AV1_COMP *cpi, ThreadData *td, TileDataEnc *tile_data,
                          MB_MODE_INFO **mib, TokenExtra **tp, int mi_row,
                          int mi_col, BLOCK_SIZE bsize, int *rate,
                          int64_t *dist, int do_recon, PC_TREE *pc_tree) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int num_planes = av1_num_planes(cm);
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  const int pl = (bsize >= BLOCK_8X8)
                     ? partition_plane_context(xd, mi_row, mi_col, bsize)
                     : 0;
  const PARTITION_TYPE partition =
      (bsize >= BLOCK_8X8) ? get_partition(cm, mi_row, mi_col, bsize)
                           : PARTITION_NONE;
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  RD_STATS last_part_rdc, none_rdc, chosen_rdc, invalid_rdc;
  BLOCK_SIZE bs_type = mib[0]->bsize;
  int use_partition_none = 0;
  x->try_merge_partition = 0;

  if (pc_tree->none == NULL) {
    pc_tree->none = av1_alloc_pmc(cpi, bsize, &td->shared_coeff_buf);
    if (!pc_tree->none)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
  }
  PICK_MODE_CONTEXT *ctx_none = pc_tree->none;

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;

  assert(mi_size_wide[bsize] == mi_size_high[bsize]);
  // In rt mode, currently the min partition size is BLOCK_8X8.
  assert(bsize >= cpi->sf.part_sf.default_min_partition_size);

  av1_invalid_rd_stats(&last_part_rdc);
  av1_invalid_rd_stats(&none_rdc);
  av1_invalid_rd_stats(&chosen_rdc);
  av1_invalid_rd_stats(&invalid_rdc);

  pc_tree->partitioning = partition;

  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
  av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

  if (bsize == BLOCK_16X16 && cpi->vaq_refresh) {
    av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, bsize);
    x->mb_energy = av1_log_block_var(cpi, x, bsize);
  }

  // Save rdmult before it might be changed, so it can be restored later.
  const int orig_rdmult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);

  if (partition != PARTITION_NONE &&
      is_adjust_var_based_part_enabled(cm, &cpi->sf.part_sf, bsize) &&
      (mi_row + hbs < mi_params->mi_rows &&
       mi_col + hbs < mi_params->mi_cols)) {
    assert(bsize > cpi->sf.part_sf.default_min_partition_size);
    mib[0]->bsize = bsize;
    pc_tree->partitioning = PARTITION_NONE;
    x->try_merge_partition = 1;
    pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &none_rdc, PARTITION_NONE,
                  bsize, ctx_none, invalid_rdc);

    if (none_rdc.rate < INT_MAX) {
      none_rdc.rate += mode_costs->partition_cost[pl][PARTITION_NONE];
      none_rdc.rdcost = RDCOST(x->rdmult, none_rdc.rate, none_rdc.dist);
    }

    // Try to skip split partition evaluation based on none partition
    // characteristics.
    if (none_rdc.rate < INT_MAX && none_rdc.skip_txfm == 1) {
      use_partition_none = 1;
    }

    av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
    mib[0]->bsize = bs_type;
    pc_tree->partitioning = partition;
  }

  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    pc_tree->split[i] = av1_alloc_pc_tree_node(subsize);
    if (!pc_tree->split[i])
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
    pc_tree->split[i]->index = i;
  }
  switch (partition) {
    case PARTITION_NONE:
      pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &last_part_rdc,
                    PARTITION_NONE, bsize, ctx_none, invalid_rdc);
      break;
    case PARTITION_HORZ:
      if (use_partition_none) {
        av1_invalid_rd_stats(&last_part_rdc);
        break;
      }

      for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
        pc_tree->horizontal[i] =
            av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
        if (!pc_tree->horizontal[i])
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      }
      pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &last_part_rdc,
                    PARTITION_HORZ, subsize, pc_tree->horizontal[0],
                    invalid_rdc);
      if (last_part_rdc.rate != INT_MAX && bsize >= BLOCK_8X8 &&
          mi_row + hbs < mi_params->mi_rows) {
        RD_STATS tmp_rdc;
        const PICK_MODE_CONTEXT *const ctx_h = pc_tree->horizontal[0];
        av1_init_rd_stats(&tmp_rdc);
        av1_update_state(cpi, td, ctx_h, mi_row, mi_col, subsize, 1);
        encode_superblock(cpi, tile_data, td, tp, DRY_RUN_NORMAL, subsize,
                          NULL);
        pick_sb_modes(cpi, tile_data, x, mi_row + hbs, mi_col, &tmp_rdc,
                      PARTITION_HORZ, subsize, pc_tree->horizontal[1],
                      invalid_rdc);
        if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
          av1_invalid_rd_stats(&last_part_rdc);
          break;
        }
        last_part_rdc.rate += tmp_rdc.rate;
        last_part_rdc.dist += tmp_rdc.dist;
        last_part_rdc.rdcost += tmp_rdc.rdcost;
      }
      break;
    case PARTITION_VERT:
      if (use_partition_none) {
        av1_invalid_rd_stats(&last_part_rdc);
        break;
      }

      for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
        pc_tree->vertical[i] =
            av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
        if (!pc_tree->vertical[i])
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      }
      pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &last_part_rdc,
                    PARTITION_VERT, subsize, pc_tree->vertical[0], invalid_rdc);
      if (last_part_rdc.rate != INT_MAX && bsize >= BLOCK_8X8 &&
          mi_col + hbs < mi_params->mi_cols) {
        RD_STATS tmp_rdc;
        const PICK_MODE_CONTEXT *const ctx_v = pc_tree->vertical[0];
        av1_init_rd_stats(&tmp_rdc);
        av1_update_state(cpi, td, ctx_v, mi_row, mi_col, subsize, 1);
        encode_superblock(cpi, tile_data, td, tp, DRY_RUN_NORMAL, subsize,
                          NULL);
        pick_sb_modes(cpi, tile_data, x, mi_row, mi_col + hbs, &tmp_rdc,
                      PARTITION_VERT, subsize,
                      pc_tree->vertical[bsize > BLOCK_8X8], invalid_rdc);
        if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
          av1_invalid_rd_stats(&last_part_rdc);
          break;
        }
        last_part_rdc.rate += tmp_rdc.rate;
        last_part_rdc.dist += tmp_rdc.dist;
        last_part_rdc.rdcost += tmp_rdc.rdcost;
      }
      break;
    case PARTITION_SPLIT:
      if (use_partition_none) {
        av1_invalid_rd_stats(&last_part_rdc);
        break;
      }

      last_part_rdc.rate = 0;
      last_part_rdc.dist = 0;
      last_part_rdc.rdcost = 0;
      for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
        int x_idx = (i & 1) * hbs;
        int y_idx = (i >> 1) * hbs;
        int jj = i >> 1, ii = i & 0x01;
        RD_STATS tmp_rdc;
        if ((mi_row + y_idx >= mi_params->mi_rows) ||
            (mi_col + x_idx >= mi_params->mi_cols))
          continue;

        av1_init_rd_stats(&tmp_rdc);
        av1_rd_use_partition(
            cpi, td, tile_data,
            mib + jj * hbs * mi_params->mi_stride + ii * hbs, tp,
            mi_row + y_idx, mi_col + x_idx, subsize, &tmp_rdc.rate,
            &tmp_rdc.dist, i != (SUB_PARTITIONS_SPLIT - 1), pc_tree->split[i]);
        if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
          av1_invalid_rd_stats(&last_part_rdc);
          break;
        }
        last_part_rdc.rate += tmp_rdc.rate;
        last_part_rdc.dist += tmp_rdc.dist;
      }
      break;
    case PARTITION_VERT_A:
    case PARTITION_VERT_B:
    case PARTITION_HORZ_A:
    case PARTITION_HORZ_B:
    case PARTITION_HORZ_4:
    case PARTITION_VERT_4:
      assert(0 && "Cannot handle extended partition types");
    default: assert(0); break;
  }

  if (last_part_rdc.rate < INT_MAX) {
    last_part_rdc.rate += mode_costs->partition_cost[pl][partition];
    last_part_rdc.rdcost =
        RDCOST(x->rdmult, last_part_rdc.rate, last_part_rdc.dist);
  }

  if ((cpi->sf.part_sf.partition_search_type == VAR_BASED_PARTITION &&
       cpi->sf.part_sf.adjust_var_based_rd_partitioning > 2) &&
      partition != PARTITION_SPLIT && bsize > BLOCK_8X8 &&
      (mi_row + bs < mi_params->mi_rows ||
       mi_row + hbs == mi_params->mi_rows) &&
      (mi_col + bs < mi_params->mi_cols ||
       mi_col + hbs == mi_params->mi_cols)) {
    BLOCK_SIZE split_subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
    chosen_rdc.rate = 0;
    chosen_rdc.dist = 0;

    av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
    pc_tree->partitioning = PARTITION_SPLIT;

    // Split partition.
    for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
      int x_idx = (i & 1) * hbs;
      int y_idx = (i >> 1) * hbs;
      RD_STATS tmp_rdc;

      if ((mi_row + y_idx >= mi_params->mi_rows) ||
          (mi_col + x_idx >= mi_params->mi_cols))
        continue;

      av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
      pc_tree->split[i]->partitioning = PARTITION_NONE;
      if (pc_tree->split[i]->none == NULL)
        pc_tree->split[i]->none =
            av1_alloc_pmc(cpi, split_subsize, &td->shared_coeff_buf);
      if (!pc_tree->split[i]->none)
        aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PICK_MODE_CONTEXT");
      pick_sb_modes(cpi, tile_data, x, mi_row + y_idx, mi_col + x_idx, &tmp_rdc,
                    PARTITION_SPLIT, split_subsize, pc_tree->split[i]->none,
                    invalid_rdc);

      av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
      if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
        av1_invalid_rd_stats(&chosen_rdc);
        break;
      }

      chosen_rdc.rate += tmp_rdc.rate;
      chosen_rdc.dist += tmp_rdc.dist;

      if (i != SUB_PARTITIONS_SPLIT - 1)
        encode_sb(cpi, td, tile_data, tp, mi_row + y_idx, mi_col + x_idx,
                  OUTPUT_ENABLED, split_subsize, pc_tree->split[i], NULL);

      chosen_rdc.rate += mode_costs->partition_cost[pl][PARTITION_NONE];
    }
    if (chosen_rdc.rate < INT_MAX) {
      chosen_rdc.rate += mode_costs->partition_cost[pl][PARTITION_SPLIT];
      chosen_rdc.rdcost = RDCOST(x->rdmult, chosen_rdc.rate, chosen_rdc.dist);
    }
  }

  // If last_part is better set the partitioning to that.
  if (last_part_rdc.rdcost < chosen_rdc.rdcost) {
    mib[0]->bsize = bs_type;
    if (bsize >= BLOCK_8X8) pc_tree->partitioning = partition;

    chosen_rdc = last_part_rdc;
  }
  // If none was better set the partitioning to that.
  if (none_rdc.rdcost < INT64_MAX &&
      none_rdc.rdcost - (none_rdc.rdcost >> 9) < chosen_rdc.rdcost) {
    mib[0]->bsize = bsize;
    if (bsize >= BLOCK_8X8) pc_tree->partitioning = PARTITION_NONE;
    chosen_rdc = none_rdc;
  }

  av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

  // We must have chosen a partitioning and encoding or we'll fail later on.
  // No other opportunities for success.
  if (bsize == cm->seq_params->sb_size)
    assert(chosen_rdc.rate < INT_MAX && chosen_rdc.dist < INT64_MAX);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, encode_sb_time);
#endif
  if (do_recon) {
    if (bsize == cm->seq_params->sb_size) {
      // NOTE: To get estimate for rate due to the tokens, use:
      // int rate_coeffs = 0;
      // encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, DRY_RUN_COSTCOEFFS,
      //           bsize, pc_tree, &rate_coeffs);
      set_cb_offsets(x->cb_offset, 0, 0);
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, OUTPUT_ENABLED, bsize,
                pc_tree, NULL);
    } else {
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, DRY_RUN_NORMAL, bsize,
                pc_tree, NULL);
    }
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, encode_sb_time);
#endif

  *rate = chosen_rdc.rate;
  *dist = chosen_rdc.dist;
  x->rdmult = orig_rdmult;
}